

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield_cpu.cpp
# Opt level: O2

void __thiscall MeanField::CPU::CRF::filterGaussian(CRF *this,float *unaries)

{
  int i;
  int iVar1;
  int j_1;
  int j;
  int iVar2;
  
  if (this->separable == false) {
    for (iVar1 = 0; iVar1 < this->height; iVar1 = iVar1 + 1) {
      for (iVar2 = 0; iVar2 < this->width; iVar2 = iVar2 + 1) {
        Filtering::applyGaussianKernel
                  ((this->spatialKernel)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl,unaries,
                   (this->gaussianOut)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl,this->spatialSD,
                   this->dimensions,iVar2,iVar1,this->width,this->height);
      }
    }
  }
  else {
    for (iVar1 = 0; iVar2 = this->height, iVar1 < iVar2; iVar1 = iVar1 + 1) {
      for (iVar2 = 0; iVar2 < this->width; iVar2 = iVar2 + 1) {
        Filtering::applyGaussianKernelX
                  (unaries,(this->filterOutTmp)._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl,
                   (this->spatialKernel)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl,this->spatialSD,
                   this->dimensions,iVar2,iVar1,this->width,this->height);
      }
    }
    for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
      for (iVar2 = 0; iVar2 < this->width; iVar2 = iVar2 + 1) {
        Filtering::applyGaussianKernelY
                  ((this->filterOutTmp)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl,
                   (this->gaussianOut)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl,
                   (this->spatialKernel)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl,this->spatialSD,
                   this->dimensions,iVar2,iVar1,this->width,this->height);
      }
      iVar2 = this->height;
    }
  }
  return;
}

Assistant:

void CRF::filterGaussian(const float *unaries) {
    if (!separable) {
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernel(spatialKernel.get(), unaries, gaussianOut.get(), spatialSD, dimensions, j, i, width, height);
            }
        }
    }
    else {
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernelX(unaries, filterOutTmp.get(), spatialKernel.get(), spatialSD,
                    dimensions, j, i, width, height);
            }
        }

        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernelY(filterOutTmp.get(), gaussianOut.get(), spatialKernel.get(), spatialSD,
                    dimensions, j, i, width, height);
            }
        }
    }
}